

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.cpp
# Opt level: O0

void __thiscall MD5Context::Final(MD5Context *this,BYTE *digest)

{
  int iVar1;
  undefined1 *puVar2;
  uint uVar3;
  DWORD *local_28;
  BYTE *p;
  int count;
  BYTE *digest_local;
  MD5Context *this_local;
  
  uVar3 = this->bytes[0] & 0x3f;
  puVar2 = (undefined1 *)((long)this->in + (long)(int)uVar3);
  local_28 = (DWORD *)(puVar2 + 1);
  *puVar2 = 0x80;
  iVar1 = -uVar3;
  p._4_4_ = iVar1 + 0x37;
  if (p._4_4_ < 0) {
    memset(local_28,0,(long)(iVar1 + 0x3f));
    MD5Transform(this->buf,this->in);
    local_28 = this->in;
    p._4_4_ = 0x38;
  }
  memset(local_28,0,(long)p._4_4_);
  this->in[0xe] = this->bytes[0] << 3;
  this->in[0xf] = this->bytes[1] << 3 | this->bytes[0] >> 0x1d;
  MD5Transform(this->buf,this->in);
  *(undefined8 *)digest = *(undefined8 *)this->buf;
  *(undefined8 *)(digest + 8) = *(undefined8 *)(this->buf + 2);
  memset(this,0,0x58);
  return;
}

Assistant:

void MD5Context::Final(BYTE digest[16])
{
	int count = bytes[0] & 0x3f;	/* Number of bytes in ctx->in */
	BYTE *p = (BYTE *)in + count;

	/* Set the first char of padding to 0x80.  There is always room. */
	*p++ = 0x80;

	/* Bytes of padding needed to make 56 bytes (-8..55) */
	count = 56 - 1 - count;

	if (count < 0)		/* Padding forces an extra block */
	{
		memset(p, 0, count + 8);
		byteSwap(in, 16);
		MD5Transform(buf, in);
		p = (BYTE *)in;
		count = 56;
	}
	memset(p, 0, count);
	byteSwap(in, 14);

	/* Append length in bits and transform */
	in[14] = bytes[0] << 3;
	in[15] = (bytes[1] << 3) | (bytes[0] >> 29);
	MD5Transform(buf, in);

	byteSwap(buf, 4);
	memcpy(digest, buf, 16);
	memset(this, 0, sizeof(*this));	/* In case it's sensitive */
}